

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

vector<Node> * __thiscall vector<Node>::operator=(vector<Node> *this,vector<Node> *other)

{
  uint uVar1;
  Node *pNVar2;
  Node *__s;
  ulong uVar3;
  long lVar4;
  
  uVar1 = other->_size;
  this->_size = uVar1;
  lVar4 = (long)other->_capacity;
  this->_capacity = other->_capacity;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar3 = lVar4 * 8;
  }
  __s = (Node *)operator_new__(uVar3);
  if (lVar4 != 0) {
    memset(__s,0,lVar4 * 8);
  }
  this->vect = __s;
  if (0 < (int)uVar1) {
    pNVar2 = other->vect;
    uVar3 = 0;
    do {
      __s[uVar3] = pNVar2[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }